

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryMappingTests.cpp
# Opt level: O0

void vkt::memory::anon_unknown_0::randomRanges
               (Random *rng,
               vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> *ranges,
               size_t count,VkDeviceMemory memory,VkDeviceSize minOffset,VkDeviceSize maxSize,
               VkDeviceSize atomSize)

{
  VkDeviceSize VVar1;
  VkDeviceSize VVar2;
  reference __dest;
  undefined4 local_78 [2];
  VkMappedMemoryRange range;
  VkDeviceSize offset;
  VkDeviceSize size;
  size_t rangeNdx;
  VkDeviceSize maxSize_local;
  VkDeviceSize minOffset_local;
  size_t count_local;
  vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_> *ranges_local;
  Random *rng_local;
  VkDeviceMemory memory_local;
  
  std::vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::resize
            (ranges,count);
  for (size = 0; size < count; size = size + 1) {
    VVar1 = randomSize(rng,atomSize,maxSize);
    VVar2 = randomOffset(rng,atomSize,maxSize - VVar1);
    range.memory.m_internal = minOffset + VVar2;
    local_78[0] = 6;
    range.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    range._4_4_ = 0;
    range.pNext = (void *)memory.m_internal;
    range.offset = VVar1;
    range.size = range.memory.m_internal;
    __dest = std::vector<vk::VkMappedMemoryRange,_std::allocator<vk::VkMappedMemoryRange>_>::
             operator[](ranges,size);
    memcpy(__dest,local_78,0x28);
  }
  return;
}

Assistant:

void randomRanges (de::Random& rng, vector<VkMappedMemoryRange>& ranges, size_t count, VkDeviceMemory memory, VkDeviceSize minOffset, VkDeviceSize maxSize, VkDeviceSize atomSize)
{
	ranges.resize(count);

	for (size_t rangeNdx = 0; rangeNdx < count; rangeNdx++)
	{
		const VkDeviceSize	size	= randomSize(rng, atomSize, maxSize);
		const VkDeviceSize	offset	= minOffset + randomOffset(rng, atomSize, maxSize - size);

		const VkMappedMemoryRange range =
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,
			DE_NULL,

			memory,
			offset,
			size
		};
		ranges[rangeNdx] = range;
	}
}